

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<TPZFlopCounter>::Decompose_LU(TPZMatrix<TPZFlopCounter> *this)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t j;
  long lVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  TPZFlopCounter nn;
  double local_50;
  double local_48;
  
  bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar2) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar2 == 0) {
    lVar3 = (this->super_TPZBaseMatrix).fRow;
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 < lVar3) {
      lVar3 = lVar1;
    }
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    lVar1 = 0;
    while (lVar5 = lVar1, lVar5 != lVar3) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar5);
      local_48 = extraout_XMM0_Qa;
      if (ABS(extraout_XMM0_Qa) < 1e-12) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
      }
      lVar1 = lVar5 + 1;
      for (lVar4 = lVar1; lVar4 < (this->super_TPZBaseMatrix).fRow; lVar4 = lVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar5);
        TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
        nn.fVal = extraout_XMM0_Qa_00 / local_48;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar4,lVar5,&nn)
        ;
        for (lVar6 = lVar1; lVar6 < (this->super_TPZBaseMatrix).fCol; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar6);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar5,lVar6);
          local_50 = extraout_XMM0_Qa_01 - extraout_XMM0_Qa_02 * nn.fVal;
          TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
          TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar4,lVar6,&local_50);
        }
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}